

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

OrderedPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OrderedPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          PropertyExprSyntax *args_1)

{
  OrderedPortConnectionSyntax *this_00;
  PropertyExprSyntax *args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (OrderedPortConnectionSyntax *)allocate(this,0x48,8);
  slang::syntax::OrderedPortConnectionSyntax::OrderedPortConnectionSyntax(this_00,args,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }